

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

string * QPDFJob::job_json_schema_v1_abi_cxx11_(void)

{
  size_type sVar1;
  pointer __dest;
  string *in_RDI;
  size_type __dnew;
  size_type local_20;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  local_20 = 0x1d95;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_20);
  sVar1 = local_20;
  (in_RDI->_M_dataplus)._M_p = __dest;
  (in_RDI->field_2)._M_allocated_capacity = local_20;
  memcpy(__dest,
         "{\n  \"inputFile\": \"input filename\",\n  \"password\": \"password for encrypted file\",\n  \"passwordFile\": \"read password from a file\",\n  \"empty\": \"use empty file as input\",\n  \"jsonInput\": \"input file is qpdf JSON\",\n  \"outputFile\": \"output filename\",\n  \"replaceInput\": \"overwrite input with output\",\n  \"qdf\": \"enable viewing PDF code in a text editor\",\n  \"preserveUnreferenced\": \"preserve unreferenced objects\",\n  \"newlineBeforeEndstream\": \"force a newline before endstream\",\n  \"normalizeContent\": \"fix newlines in content streams\",\n  \"streamData\": \"control stream compression\",\n  \"compressStreams\": \"compress uncompressed streams\",\n  \"recompressFlate\": \"uncompress and recompress flate\",\n  \"decodeLevel\": \"control which streams to uncompress\",\n  \"decrypt\": \"remove encryption from input file\",\n  \"deterministicId\": \"generate ID deterministically\",\n  \"staticAesIv\": \"use a fixed AES vector\",\n  \"staticId\": \"use a fixed document ID\",\n  \"noOriginalObjectIds\": \"omit original object IDs in qdf\",\n  \"copyEncryption\": \"copy another file\'s encryption details\",\n  \"encryptionFilePassword\": \"supply password for copyEncryption\",\n  \"linearize\": \"linearize (web-optimize) output\",\n  \"linearizePass1\": \"save pass 1 of linearization\",\n  \"objectStreams\": \"control use of object streams\",\n  \"minVersion\": \"set minimum PDF version\",\n  \"forceVersion\": \"set output PDF version\",\n  \"progress\": \"show progress when writing\",\n  \"splitPages\": \"write pages to separate files\",\n  \"jsonOutput\": \"apply defaults for JSON serialization\",\n  \"removeRestrictions\": \"remove security restrictions from input file\",\n  \"encrypt\": {\n    \"userPassword\": \"specify user password\",\n    \"ownerPassword\": \"specify owner password\",\n    \"Bits\": null,\n    \"40bit\": {\n      \"annotate\": \"restrict document annotation\",\n      \"extract\": \"restrict text/graphic extraction\",\n      \"modify\": \"restrict document modification\",\n      \"print\": \"restrict printing\"\n    },\n    \"128bit\": {\n      \"accessibility\": \"restrict document accessibility\",\n      \"annotate\": \"restrict document annotation\",\n      \"assembl..." /* TRUNCATED STRING LITERAL */
         ,0x1d95);
  in_RDI->_M_string_length = sVar1;
  __dest[sVar1] = '\0';
  return in_RDI;
}

Assistant:

std::string
QPDFJob::job_json_schema_v1()
{
    return job_json_schema(1);
}